

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

json_string * __thiscall
JSONNode::write_formatted_abi_cxx11_
          (json_string *__return_storage_ptr__,JSONNode *this,size_t approxsize)

{
  uchar uVar1;
  json_string *pjVar2;
  bool bVar3;
  size_t approxsize_local;
  JSONNode *this_local;
  json_string *result;
  
  uVar1 = type(this);
  bVar3 = true;
  if (uVar1 != '\x05') {
    uVar1 = type(this);
    bVar3 = uVar1 == '\x04';
  }
  if (bVar3) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    internalJSONNode::Write(this->internal,0,true,__return_storage_ptr__);
  }
  else {
    pjVar2 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pjVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline json_string JSONNode::write_formatted(size_t approxsize) const json_nothrow {
	    JSON_CHECK_INTERNAL();
	    JSON_ASSERT_SAFE(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Writing a non-writable node"), return json_global(EMPTY_JSON_STRING););
		json_string result;
		result.reserve(approxsize);
		internal -> Write(0, true, result);
		return result;
    }